

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

void __thiscall BigInt::BigInt(BigInt *this,int length,int init_value,bool positive_sign)

{
  runtime_error *this_00;
  allocator_type local_35;
  int init_value_local;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  init_value_local = init_value;
  if (0xfffffff6 < init_value - 10U) {
    this->sign = (uint)!positive_sign;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_30,(long)(length + 1),&init_value_local,
               &local_35);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->value,&local_30);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
    *(this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = this->sign;
    this->real_length = length;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"ERROR init value must > 0 and < 10!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BigInt::BigInt(int length, int init_value, bool positive_sign) {
    if (init_value <= 0 || init_value > 9) {
        throw runtime_error("ERROR init value must > 0 and < 10!");
    }
    this->sign = positive_sign ? 0 : 1;
    this->value = vector<int>(length + 1, init_value);
    this->value[0] = this->sign;
    this->real_length = length;
}